

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint8_avx2.h
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::InstanceIntersectorK<8>_>,_false>
     ::intersectCoherent(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,
                        RayQueryContext *context)

{
  undefined1 (*pauVar1) [16];
  ulong *puVar2;
  undefined1 (*pauVar3) [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  undefined4 uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  Primitive *prim;
  ulong uVar25;
  ulong *puVar26;
  undefined1 auVar27 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  vint4 bi;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined4 in_register_000015dc;
  undefined1 auVar55 [64];
  Precalculations pre;
  vbool<8> valid_leaf;
  vfloat<4> fmin;
  vint<8> octant;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1301;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_1300;
  undefined1 local_12e0 [16];
  undefined4 local_12d0;
  undefined4 uStack_12cc;
  undefined4 uStack_12c8;
  undefined4 uStack_12c4;
  AccelData *local_12b8;
  ulong local_12b0;
  RayHitK<8> *local_12a8;
  RayQueryContext *local_12a0;
  ulong local_1298;
  ulong local_1290;
  ulong local_1288;
  undefined1 local_1280 [32];
  uint local_1250;
  uint uStack_124c;
  uint uStack_1248;
  uint uStack_1244;
  undefined4 local_1240;
  undefined4 uStack_123c;
  undefined4 uStack_1238;
  undefined4 uStack_1234;
  uint local_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  undefined1 local_1220 [16];
  uint local_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  undefined1 local_1200 [16];
  uint local_11f0;
  uint uStack_11ec;
  uint uStack_11e8;
  uint uStack_11e4;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  uint local_11d0;
  uint uStack_11cc;
  uint uStack_11c8;
  uint uStack_11c4;
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  undefined1 local_11a0 [16];
  uint local_1190;
  uint uStack_118c;
  uint uStack_1188;
  uint uStack_1184;
  float local_1180;
  float fStack_117c;
  float fStack_1178;
  float fStack_1174;
  undefined1 local_1170 [16];
  undefined1 local_1160 [32];
  float local_1140;
  float fStack_113c;
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  undefined4 uStack_1124;
  float local_1120;
  float fStack_111c;
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  undefined4 uStack_1104;
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  undefined4 uStack_10e4;
  undefined1 local_10e0 [32];
  undefined4 local_10c0;
  undefined4 uStack_10bc;
  undefined4 uStack_10b8;
  undefined4 uStack_10b4;
  undefined4 uStack_10b0;
  undefined4 uStack_10ac;
  undefined4 uStack_10a8;
  undefined4 uStack_10a4;
  undefined1 local_10a0 [32];
  float local_1080;
  float fStack_107c;
  float fStack_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float fStack_1068;
  undefined4 uStack_1064;
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  undefined4 uStack_1044;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  ulong local_fa0;
  undefined4 local_f98 [2];
  ulong local_f90 [492];
  undefined1 auVar31 [64];
  
  auVar8 = vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
  auVar27 = vpcmpeqd_avx2(auVar8,(undefined1  [32])valid_i->field_0);
  uVar16 = vmovmskps_avx(auVar27);
  if (uVar16 != 0) {
    local_12b8 = This->ptr;
    local_12b0 = (ulong)(uVar16 & 0xff);
    auVar4 = *(undefined1 (*) [32])(ray + 0x80);
    auVar41._8_4_ = 0x7fffffff;
    auVar41._0_8_ = 0x7fffffff7fffffff;
    auVar41._12_4_ = 0x7fffffff;
    auVar41._16_4_ = 0x7fffffff;
    auVar41._20_4_ = 0x7fffffff;
    auVar41._24_4_ = 0x7fffffff;
    auVar41._28_4_ = 0x7fffffff;
    auVar43._8_4_ = 0x219392ef;
    auVar43._0_8_ = 0x219392ef219392ef;
    auVar43._12_4_ = 0x219392ef;
    auVar43._16_4_ = 0x219392ef;
    auVar43._20_4_ = 0x219392ef;
    auVar43._24_4_ = 0x219392ef;
    auVar43._28_4_ = 0x219392ef;
    auVar36 = vandps_avx(auVar4,auVar41);
    auVar36 = vcmpps_avx(auVar36,auVar43,1);
    auVar44 = vblendvps_avx(auVar4,auVar43,auVar36);
    auVar36 = *(undefined1 (*) [32])(ray + 0xa0);
    auVar35 = vandps_avx(auVar36,auVar41);
    auVar35 = vcmpps_avx(auVar35,auVar43,1);
    auVar45 = vblendvps_avx(auVar36,auVar43,auVar35);
    auVar35 = *(undefined1 (*) [32])(ray + 0xc0);
    auVar41 = vandps_avx(auVar35,auVar41);
    auVar41 = vcmpps_avx(auVar41,auVar43,1);
    auVar7 = vrcpps_avx(auVar44);
    auVar41 = vblendvps_avx(auVar35,auVar43,auVar41);
    auVar40._8_4_ = 0x3f800000;
    auVar40._0_8_ = 0x3f8000003f800000;
    auVar40._12_4_ = 0x3f800000;
    auVar40._16_4_ = 0x3f800000;
    auVar40._20_4_ = 0x3f800000;
    auVar40._24_4_ = 0x3f800000;
    auVar40._28_4_ = 0x3f800000;
    auVar9 = vfnmadd213ps_fma(auVar44,auVar7,auVar40);
    auVar44 = vrcpps_avx(auVar45);
    auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar7,auVar7);
    auVar52 = ZEXT1664(auVar9);
    auVar7 = vrcpps_avx(auVar41);
    auVar10 = vfnmadd213ps_fma(auVar45,auVar44,auVar40);
    auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar44,auVar44);
    auVar53 = ZEXT1664(auVar10);
    auVar11 = vfnmadd213ps_fma(auVar41,auVar7,auVar40);
    auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar7,auVar7);
    auVar54 = ZEXT1664(auVar11);
    auVar41 = ZEXT1232(ZEXT812(0)) << 0x20;
    local_1160 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar41);
    local_10a0 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar41);
    auVar41 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar4 = vcmpps_avx(auVar4,auVar41,1);
    auVar44._8_4_ = 1;
    auVar44._0_8_ = 0x100000001;
    auVar44._12_4_ = 1;
    auVar44._16_4_ = 1;
    auVar44._20_4_ = 1;
    auVar44._24_4_ = 1;
    auVar44._28_4_ = 1;
    auVar4 = vandps_avx(auVar4,auVar44);
    auVar36 = vcmpps_avx(auVar36,auVar41,1);
    auVar45._8_4_ = 2;
    auVar45._0_8_ = 0x200000002;
    auVar45._12_4_ = 2;
    auVar45._16_4_ = 2;
    auVar45._20_4_ = 2;
    auVar45._24_4_ = 2;
    auVar45._28_4_ = 2;
    auVar36 = vandps_avx(auVar36,auVar45);
    auVar36 = vorps_avx(auVar36,auVar4);
    auVar4 = vcmpps_avx(auVar35,auVar41,1);
    auVar35._8_4_ = 4;
    auVar35._0_8_ = 0x400000004;
    auVar35._12_4_ = 4;
    auVar35._16_4_ = 4;
    auVar35._20_4_ = 4;
    auVar35._24_4_ = 4;
    auVar35._28_4_ = 4;
    auVar4 = vandps_avx(auVar4,auVar35);
    auVar8 = vpor_avx2(auVar27 ^ auVar8,auVar4);
    local_10e0 = vpor_avx2(auVar8,auVar36);
    local_1040 = *(float *)ray;
    fStack_103c = *(float *)(ray + 4);
    fStack_1038 = *(float *)(ray + 8);
    fStack_1034 = *(float *)(ray + 0xc);
    fStack_1030 = *(float *)(ray + 0x10);
    fStack_102c = *(float *)(ray + 0x14);
    fStack_1028 = *(float *)(ray + 0x18);
    uStack_1024 = *(undefined4 *)(ray + 0x1c);
    local_1060 = *(float *)(ray + 0x20);
    fStack_105c = *(float *)(ray + 0x24);
    fStack_1058 = *(float *)(ray + 0x28);
    fStack_1054 = *(float *)(ray + 0x2c);
    fStack_1050 = *(float *)(ray + 0x30);
    fStack_104c = *(float *)(ray + 0x34);
    fStack_1048 = *(float *)(ray + 0x38);
    uStack_1044 = *(undefined4 *)(ray + 0x3c);
    local_1080 = *(float *)(ray + 0x40);
    fStack_107c = *(float *)(ray + 0x44);
    fStack_1078 = *(float *)(ray + 0x48);
    fStack_1074 = *(float *)(ray + 0x4c);
    fStack_1070 = *(float *)(ray + 0x50);
    fStack_106c = *(float *)(ray + 0x54);
    fStack_1068 = *(float *)(ray + 0x58);
    uStack_1064 = *(undefined4 *)(ray + 0x5c);
    local_1250 = 0x80000000;
    uStack_124c = 0x80000000;
    uStack_1248 = 0x80000000;
    uStack_1244 = 0x80000000;
    local_10c0 = 0x7f800000;
    uStack_10bc = 0x7f800000;
    uStack_10b8 = 0x7f800000;
    uStack_10b4 = 0x7f800000;
    uStack_10b0 = 0x7f800000;
    uStack_10ac = 0x7f800000;
    uStack_10a8 = 0x7f800000;
    uStack_10a4 = 0x7f800000;
    local_fe0 = ZEXT1632(auVar9);
    local_1000 = ZEXT1632(auVar10);
    local_1020 = ZEXT1632(auVar11);
    local_1100 = auVar9._0_4_ * -*(float *)ray;
    fStack_10fc = auVar9._4_4_ * -*(float *)(ray + 4);
    fStack_10f8 = auVar9._8_4_ * -*(float *)(ray + 8);
    fStack_10f4 = auVar9._12_4_ * -*(float *)(ray + 0xc);
    fStack_10f0 = -*(float *)(ray + 0x10) * 0.0;
    fStack_10ec = -*(float *)(ray + 0x14) * 0.0;
    fStack_10e8 = -*(float *)(ray + 0x18) * 0.0;
    local_1120 = auVar10._0_4_ * -*(float *)(ray + 0x20);
    fStack_111c = auVar10._4_4_ * -*(float *)(ray + 0x24);
    fStack_1118 = auVar10._8_4_ * -*(float *)(ray + 0x28);
    fStack_1114 = auVar10._12_4_ * -*(float *)(ray + 0x2c);
    fStack_1110 = -*(float *)(ray + 0x30) * 0.0;
    fStack_110c = -*(float *)(ray + 0x34) * 0.0;
    fStack_1108 = -*(float *)(ray + 0x38) * 0.0;
    uStack_1104 = *(undefined4 *)(ray + 0x3c);
    local_1140 = auVar11._0_4_ * -*(float *)(ray + 0x40);
    fStack_113c = auVar11._4_4_ * -*(float *)(ray + 0x44);
    fStack_1138 = auVar11._8_4_ * -*(float *)(ray + 0x48);
    fStack_1134 = auVar11._12_4_ * -*(float *)(ray + 0x4c);
    fStack_1130 = -*(float *)(ray + 0x50) * 0.0;
    fStack_112c = -*(float *)(ray + 0x54) * 0.0;
    fStack_1128 = -*(float *)(ray + 0x58) * 0.0;
    uStack_1124 = *(undefined4 *)(ray + 0x5c);
    local_12a8 = ray;
    local_12a0 = context;
    uStack_10e4 = in_register_000015dc;
    do {
      lVar18 = 0;
      for (uVar21 = local_12b0; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
        lVar18 = lVar18 + 1;
      }
      uVar17 = *(undefined4 *)(local_10e0 + lVar18 * 4);
      auVar27._4_4_ = uVar17;
      auVar27._0_4_ = uVar17;
      auVar27._8_4_ = uVar17;
      auVar27._12_4_ = uVar17;
      auVar27._16_4_ = uVar17;
      auVar27._20_4_ = uVar17;
      auVar27._24_4_ = uVar17;
      auVar27._28_4_ = uVar17;
      auVar35 = vpcmpeqd_avx2(auVar27,local_10e0);
      uVar17 = vmovmskps_avx(auVar35);
      local_12b0 = ~CONCAT44((int)((ulong)lVar18 >> 0x20),uVar17) & local_12b0;
      auVar7._4_4_ = fStack_103c;
      auVar7._0_4_ = local_1040;
      auVar7._8_4_ = fStack_1038;
      auVar7._12_4_ = fStack_1034;
      auVar7._16_4_ = fStack_1030;
      auVar7._20_4_ = fStack_102c;
      auVar7._24_4_ = fStack_1028;
      auVar7._28_4_ = uStack_1024;
      auVar49._8_4_ = 0x7f800000;
      auVar49._0_8_ = 0x7f8000007f800000;
      auVar49._12_4_ = 0x7f800000;
      auVar49._16_4_ = 0x7f800000;
      auVar49._20_4_ = 0x7f800000;
      auVar49._24_4_ = 0x7f800000;
      auVar49._28_4_ = 0x7f800000;
      auVar8 = vblendvps_avx(auVar49,auVar7,auVar35);
      auVar27 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vminps_avx(auVar8,auVar27);
      auVar27 = vshufpd_avx(auVar8,auVar8,5);
      auVar8 = vminps_avx(auVar8,auVar27);
      auVar9 = vminps_avx(auVar8._0_16_,auVar8._16_16_);
      auVar36._4_4_ = fStack_105c;
      auVar36._0_4_ = local_1060;
      auVar36._8_4_ = fStack_1058;
      auVar36._12_4_ = fStack_1054;
      auVar36._16_4_ = fStack_1050;
      auVar36._20_4_ = fStack_104c;
      auVar36._24_4_ = fStack_1048;
      auVar36._28_4_ = uStack_1044;
      auVar8 = vblendvps_avx(auVar49,auVar36,auVar35);
      auVar27 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vminps_avx(auVar8,auVar27);
      auVar27 = vshufpd_avx(auVar8,auVar8,5);
      auVar8 = vminps_avx(auVar8,auVar27);
      auVar10 = vminps_avx(auVar8._0_16_,auVar8._16_16_);
      auVar10 = vunpcklps_avx(auVar9,auVar10);
      auVar4._4_4_ = fStack_107c;
      auVar4._0_4_ = local_1080;
      auVar4._8_4_ = fStack_1078;
      auVar4._12_4_ = fStack_1074;
      auVar4._16_4_ = fStack_1070;
      auVar4._20_4_ = fStack_106c;
      auVar4._24_4_ = fStack_1068;
      auVar4._28_4_ = uStack_1064;
      auVar8 = vblendvps_avx(auVar49,auVar4,auVar35);
      auVar27 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vminps_avx(auVar8,auVar27);
      auVar27 = vshufpd_avx(auVar8,auVar8,5);
      auVar8 = vminps_avx(auVar8,auVar27);
      auVar9 = vminps_avx(auVar8._0_16_,auVar8._16_16_);
      auVar48._8_4_ = 0xff800000;
      auVar48._0_8_ = 0xff800000ff800000;
      auVar48._12_4_ = 0xff800000;
      auVar48._16_4_ = 0xff800000;
      auVar48._20_4_ = 0xff800000;
      auVar48._24_4_ = 0xff800000;
      auVar48._28_4_ = 0xff800000;
      auVar8 = vblendvps_avx(auVar48,auVar7,auVar35);
      auVar11 = vinsertps_avx(auVar10,auVar9,0x28);
      auVar27 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vmaxps_avx(auVar8,auVar27);
      auVar27 = vshufpd_avx(auVar8,auVar8,5);
      auVar27 = vmaxps_avx(auVar8,auVar27);
      auVar8 = vblendvps_avx(auVar48,auVar36,auVar35);
      auVar9 = vmaxps_avx(auVar27._0_16_,auVar27._16_16_);
      auVar27 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vmaxps_avx(auVar8,auVar27);
      auVar27 = vshufpd_avx(auVar8,auVar8,5);
      auVar8 = vmaxps_avx(auVar8,auVar27);
      auVar10 = vmaxps_avx(auVar8._0_16_,auVar8._16_16_);
      auVar10 = vunpcklps_avx(auVar9,auVar10);
      auVar8 = vblendvps_avx(auVar48,auVar4,auVar35);
      auVar27 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vmaxps_avx(auVar8,auVar27);
      auVar27 = vshufpd_avx(auVar8,auVar8,5);
      auVar8 = vmaxps_avx(auVar8,auVar27);
      auVar9 = vmaxps_avx(auVar8._0_16_,auVar8._16_16_);
      auVar6 = vinsertps_avx(auVar10,auVar9,0x28);
      auVar8 = vblendvps_avx(auVar49,auVar52._0_32_,auVar35);
      auVar27 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vminps_avx(auVar8,auVar27);
      auVar27 = vshufpd_avx(auVar8,auVar8,5);
      auVar8 = vminps_avx(auVar8,auVar27);
      auVar9 = vminps_avx(auVar8._0_16_,auVar8._16_16_);
      auVar8 = vblendvps_avx(auVar49,auVar53._0_32_,auVar35);
      auVar27 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vminps_avx(auVar8,auVar27);
      auVar27 = vshufpd_avx(auVar8,auVar8,5);
      auVar8 = vminps_avx(auVar8,auVar27);
      auVar10 = vminps_avx(auVar8._0_16_,auVar8._16_16_);
      auVar10 = vunpcklps_avx(auVar9,auVar10);
      auVar8 = vblendvps_avx(auVar49,auVar54._0_32_,auVar35);
      auVar27 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vminps_avx(auVar8,auVar27);
      auVar27 = vshufpd_avx(auVar8,auVar8,5);
      auVar8 = vminps_avx(auVar8,auVar27);
      auVar9 = vminps_avx(auVar8._0_16_,auVar8._16_16_);
      auVar8 = vblendvps_avx(auVar48,auVar52._0_32_,auVar35);
      auVar28 = vinsertps_avx(auVar10,auVar9,0x28);
      auVar27 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vmaxps_avx(auVar8,auVar27);
      auVar27 = vshufpd_avx(auVar8,auVar8,5);
      auVar27 = vmaxps_avx(auVar8,auVar27);
      auVar8 = vblendvps_avx(auVar48,auVar53._0_32_,auVar35);
      auVar9 = vmaxps_avx(auVar27._0_16_,auVar27._16_16_);
      auVar27 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vmaxps_avx(auVar8,auVar27);
      auVar27 = vshufpd_avx(auVar8,auVar8,5);
      auVar8 = vmaxps_avx(auVar8,auVar27);
      auVar10 = vmaxps_avx(auVar8._0_16_,auVar8._16_16_);
      auVar10 = vunpcklps_avx(auVar9,auVar10);
      auVar8 = vblendvps_avx(auVar48,auVar54._0_32_,auVar35);
      auVar27 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vmaxps_avx(auVar8,auVar27);
      auVar27 = vshufpd_avx(auVar8,auVar8,5);
      auVar8 = vmaxps_avx(auVar8,auVar27);
      auVar9 = vmaxps_avx(auVar8._0_16_,auVar8._16_16_);
      auVar39 = vinsertps_avx(auVar10,auVar9,0x28);
      auVar8 = vblendvps_avx(auVar49,local_1160,auVar35);
      auVar27 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vminps_avx(auVar8,auVar27);
      auVar27 = vshufpd_avx(auVar8,auVar8,5);
      auVar4 = vminps_avx(auVar8,auVar27);
      auVar8 = vblendvps_avx(auVar48,local_10a0,auVar35);
      auVar27 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar27 = vmaxps_avx(auVar8,auVar27);
      auVar36 = vshufpd_avx(auVar27,auVar27,5);
      auVar27 = vmaxps_avx(auVar27,auVar36);
      auVar5 = vcmpps_avx(auVar28,_DAT_01f7aa10,5);
      auVar9 = vblendvps_avx(auVar39,auVar28,auVar5);
      auVar10 = vblendvps_avx(auVar11,auVar6,auVar5);
      local_12e0 = vmaxps_avx(auVar27._0_16_,auVar27._16_16_);
      auVar51 = ZEXT3264(CONCAT428(uStack_1124,
                                   CONCAT424(fStack_1128,
                                             CONCAT420(fStack_112c,
                                                       CONCAT416(fStack_1130,
                                                                 CONCAT412(fStack_1134,
                                                                           CONCAT48(fStack_1138,
                                                                                    CONCAT44(
                                                  fStack_113c,local_1140))))))));
      auVar50 = ZEXT3264(CONCAT428(uStack_1104,
                                   CONCAT424(fStack_1108,
                                             CONCAT420(fStack_110c,
                                                       CONCAT416(fStack_1110,
                                                                 CONCAT412(fStack_1114,
                                                                           CONCAT48(fStack_1118,
                                                                                    CONCAT44(
                                                  fStack_111c,local_1120))))))));
      auVar11 = vblendvps_avx(auVar6,auVar11,auVar5);
      local_1180 = auVar9._0_4_;
      auVar6 = vmovshdup_avx(auVar9);
      local_1288 = (ulong)(auVar6._0_4_ < 0.0) << 4 | 0x20;
      auVar6 = vshufpd_avx(auVar9,auVar9,1);
      uVar25 = (ulong)(auVar6._0_4_ < 0.0) << 4 | 0x40;
      local_1298 = local_1288 ^ 0x10;
      auVar5 = vblendvps_avx(auVar28,auVar39,auVar5);
      auVar6 = vminps_avx(auVar4._0_16_,auVar4._16_16_);
      auVar39._0_4_ = auVar10._0_4_ * local_1180;
      auVar39._4_4_ = auVar10._4_4_ * auVar9._4_4_;
      auVar39._8_4_ = auVar10._8_4_ * auVar9._8_4_;
      auVar39._12_4_ = auVar10._12_4_ * auVar9._12_4_;
      local_11e0 = auVar5._0_4_;
      auVar28._0_4_ = auVar11._0_4_ * local_11e0;
      auVar28._4_4_ = auVar11._4_4_ * auVar5._4_4_;
      auVar28._8_4_ = auVar11._8_4_ * auVar5._8_4_;
      auVar28._12_4_ = auVar11._12_4_ * auVar5._12_4_;
      local_1290 = (ulong)(local_1180 < 0.0) << 4;
      uVar21 = local_1290 ^ 0x10;
      local_fa0 = *(ulong *)&local_12b8[1].bounds.bounds0.lower.field_0;
      local_f98[0] = 0;
      local_1190 = (uint)auVar39._0_4_ ^ local_1250;
      uStack_118c = (uint)auVar39._0_4_ ^ uStack_124c;
      uStack_1188 = (uint)auVar39._0_4_ ^ uStack_1248;
      uStack_1184 = (uint)auVar39._0_4_ ^ uStack_1244;
      local_11a0 = vshufps_avx(auVar9,auVar9,0x55);
      auVar10 = vshufps_avx(auVar39,auVar39,0x55);
      local_11b0._0_4_ = auVar10._0_4_ ^ local_1250;
      local_11b0._4_4_ = auVar10._4_4_ ^ uStack_124c;
      local_11b0._8_4_ = auVar10._8_4_ ^ uStack_1248;
      local_11b0._12_4_ = auVar10._12_4_ ^ uStack_1244;
      local_11c0 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar9 = vshufps_avx(auVar39,auVar39,0xaa);
      local_11d0 = auVar9._0_4_ ^ local_1250;
      uStack_11cc = auVar9._4_4_ ^ uStack_124c;
      uStack_11c8 = auVar9._8_4_ ^ uStack_1248;
      uStack_11c4 = auVar9._12_4_ ^ uStack_1244;
      local_11f0 = (uint)auVar28._0_4_ ^ local_1250;
      uStack_11ec = (uint)auVar28._0_4_ ^ uStack_124c;
      uStack_11e8 = (uint)auVar28._0_4_ ^ uStack_1248;
      uStack_11e4 = (uint)auVar28._0_4_ ^ uStack_1244;
      local_1200 = vshufps_avx(auVar5,auVar5,0x55);
      auVar9 = vshufps_avx(auVar28,auVar28,0x55);
      local_1210 = auVar9._0_4_ ^ local_1250;
      uStack_120c = auVar9._4_4_ ^ uStack_124c;
      uStack_1208 = auVar9._8_4_ ^ uStack_1248;
      uStack_1204 = auVar9._12_4_ ^ uStack_1244;
      auVar38 = ZEXT3264(auVar8);
      local_1220 = vshufps_avx(auVar5,auVar5,0xaa);
      auVar9 = vshufps_avx(auVar28,auVar28,0xaa);
      local_1230 = auVar9._0_4_ ^ local_1250;
      uStack_122c = auVar9._4_4_ ^ uStack_124c;
      uStack_1228 = auVar9._8_4_ ^ uStack_1248;
      uStack_1224 = auVar9._12_4_ ^ uStack_1244;
      local_1240 = auVar6._0_4_;
      auVar8._4_4_ = uStack_10bc;
      auVar8._0_4_ = local_10c0;
      auVar8._8_4_ = uStack_10b8;
      auVar8._12_4_ = uStack_10b4;
      auVar8._16_4_ = uStack_10b0;
      auVar8._20_4_ = uStack_10ac;
      auVar8._24_4_ = uStack_10a8;
      auVar8._28_4_ = uStack_10a4;
      local_1280 = vblendvps_avx(auVar8,local_1160,auVar35);
      auVar55 = ZEXT3264(CONCAT428(uStack_10e4,
                                   CONCAT424(fStack_10e8,
                                             CONCAT420(fStack_10ec,
                                                       CONCAT416(fStack_10f0,
                                                                 CONCAT412(fStack_10f4,
                                                                           CONCAT48(fStack_10f8,
                                                                                    CONCAT44(
                                                  fStack_10fc,local_1100))))))));
      puVar26 = local_f90;
      local_12d0 = local_12e0._0_4_;
      uStack_12cc = local_12e0._0_4_;
      uStack_12c8 = local_12e0._0_4_;
      uStack_12c4 = local_12e0._0_4_;
      uStack_123c = local_1240;
      uStack_1238 = local_1240;
      uStack_1234 = local_1240;
      fStack_11dc = local_11e0;
      fStack_11d8 = local_11e0;
      fStack_11d4 = local_11e0;
      fStack_117c = local_1180;
      fStack_1178 = local_1180;
      fStack_1174 = local_1180;
      do {
        uVar17 = (undefined4)puVar26[-1];
        auVar30._4_4_ = uVar17;
        auVar30._0_4_ = uVar17;
        auVar30._8_4_ = uVar17;
        auVar30._12_4_ = uVar17;
        auVar30._16_4_ = uVar17;
        auVar30._20_4_ = uVar17;
        auVar30._24_4_ = uVar17;
        auVar30._28_4_ = uVar17;
        auVar31 = ZEXT3264(auVar30);
        puVar26 = puVar26 + -2;
        auVar8 = vcmpps_avx(auVar30,auVar38._0_32_,1);
        if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar8 >> 0x7f,0) != '\0') ||
              (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar8 >> 0xbf,0) != '\0') ||
            (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar8[0x1f] < '\0') {
          uVar22 = *puVar26;
          while ((uVar22 & 8) == 0) {
            auVar14._4_4_ = uStack_118c;
            auVar14._0_4_ = local_1190;
            auVar14._8_4_ = uStack_1188;
            auVar14._12_4_ = uStack_1184;
            auVar15._4_4_ = fStack_117c;
            auVar15._0_4_ = local_1180;
            auVar15._8_4_ = fStack_1178;
            auVar15._12_4_ = fStack_1174;
            auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar22 + 0x20 + local_1290),auVar14,
                                     auVar15);
            auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar22 + 0x20 + local_1288),local_11b0,
                                      local_11a0);
            auVar9 = vpmaxsd_avx(auVar9,auVar10);
            auVar13._4_4_ = uStack_11cc;
            auVar13._0_4_ = local_11d0;
            auVar13._8_4_ = uStack_11c8;
            auVar13._12_4_ = uStack_11c4;
            auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar22 + 0x20 + uVar25),auVar13,
                                      local_11c0);
            auVar5._4_4_ = uStack_123c;
            auVar5._0_4_ = local_1240;
            auVar5._8_4_ = uStack_1238;
            auVar5._12_4_ = uStack_1234;
            auVar10 = vpmaxsd_avx(auVar10,auVar5);
            local_1170 = vpmaxsd_avx(auVar9,auVar10);
            auVar9._4_4_ = uStack_11ec;
            auVar9._0_4_ = local_11f0;
            auVar9._8_4_ = uStack_11e8;
            auVar9._12_4_ = uStack_11e4;
            auVar12._4_4_ = fStack_11dc;
            auVar12._0_4_ = local_11e0;
            auVar12._8_4_ = fStack_11d8;
            auVar12._12_4_ = fStack_11d4;
            auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar22 + 0x20 + uVar21),auVar9,auVar12);
            auVar6._4_4_ = uStack_120c;
            auVar6._0_4_ = local_1210;
            auVar6._8_4_ = uStack_1208;
            auVar6._12_4_ = uStack_1204;
            auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar22 + 0x20 + local_1298),auVar6,
                                      local_1200);
            auVar9 = vpminsd_avx(auVar9,auVar10);
            auVar10._4_4_ = uStack_122c;
            auVar10._0_4_ = local_1230;
            auVar10._8_4_ = uStack_1228;
            auVar10._12_4_ = uStack_1224;
            auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar22 + 0x20 + (uVar25 ^ 0x10)),
                                      auVar10,local_1220);
            auVar11._4_4_ = uStack_12cc;
            auVar11._0_4_ = local_12d0;
            auVar11._8_4_ = uStack_12c8;
            auVar11._12_4_ = uStack_12c4;
            auVar10 = vpminsd_avx(auVar10,auVar11);
            auVar9 = vpminsd_avx(auVar9,auVar10);
            auVar9 = vcmpps_avx(local_1170,auVar9,2);
            uVar16 = vmovmskps_avx(auVar9);
            if (uVar16 == 0) goto LAB_005958ec;
            uVar19 = (ulong)(uVar16 & 0xff);
            auVar31 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            uVar20 = 0;
            uVar23 = 8;
            do {
              lVar18 = 0;
              for (uVar24 = uVar19; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                lVar18 = lVar18 + 1;
              }
              uVar17 = *(undefined4 *)(uVar22 + 0x20 + lVar18 * 4);
              auVar32._4_4_ = uVar17;
              auVar32._0_4_ = uVar17;
              auVar32._8_4_ = uVar17;
              auVar32._12_4_ = uVar17;
              auVar32._16_4_ = uVar17;
              auVar32._20_4_ = uVar17;
              auVar32._24_4_ = uVar17;
              auVar32._28_4_ = uVar17;
              uVar17 = *(undefined4 *)(uVar22 + 0x40 + lVar18 * 4);
              auVar34._4_4_ = uVar17;
              auVar34._0_4_ = uVar17;
              auVar34._8_4_ = uVar17;
              auVar34._12_4_ = uVar17;
              auVar34._16_4_ = uVar17;
              auVar34._20_4_ = uVar17;
              auVar34._24_4_ = uVar17;
              auVar34._28_4_ = uVar17;
              auVar9 = vfmadd213ps_fma(auVar32,auVar52._0_32_,auVar55._0_32_);
              auVar10 = vfmadd213ps_fma(auVar34,auVar53._0_32_,auVar50._0_32_);
              auVar36 = auVar38._0_32_;
              uVar17 = *(undefined4 *)(uVar22 + 0x60 + lVar18 * 4);
              auVar37._4_4_ = uVar17;
              auVar37._0_4_ = uVar17;
              auVar37._8_4_ = uVar17;
              auVar37._12_4_ = uVar17;
              auVar37._16_4_ = uVar17;
              auVar37._20_4_ = uVar17;
              auVar37._24_4_ = uVar17;
              auVar37._28_4_ = uVar17;
              auVar11 = vfmadd213ps_fma(auVar37,auVar54._0_32_,auVar51._0_32_);
              uVar17 = *(undefined4 *)(uVar22 + 0x30 + lVar18 * 4);
              auVar42._4_4_ = uVar17;
              auVar42._0_4_ = uVar17;
              auVar42._8_4_ = uVar17;
              auVar42._12_4_ = uVar17;
              auVar42._16_4_ = uVar17;
              auVar42._20_4_ = uVar17;
              auVar42._24_4_ = uVar17;
              auVar42._28_4_ = uVar17;
              auVar5 = vfmadd213ps_fma(auVar42,auVar52._0_32_,auVar55._0_32_);
              uVar17 = *(undefined4 *)(uVar22 + 0x50 + lVar18 * 4);
              auVar46._4_4_ = uVar17;
              auVar46._0_4_ = uVar17;
              auVar46._8_4_ = uVar17;
              auVar46._12_4_ = uVar17;
              auVar46._16_4_ = uVar17;
              auVar46._20_4_ = uVar17;
              auVar46._24_4_ = uVar17;
              auVar46._28_4_ = uVar17;
              uVar17 = *(undefined4 *)(uVar22 + 0x70 + lVar18 * 4);
              auVar47._4_4_ = uVar17;
              auVar47._0_4_ = uVar17;
              auVar47._8_4_ = uVar17;
              auVar47._12_4_ = uVar17;
              auVar47._16_4_ = uVar17;
              auVar47._20_4_ = uVar17;
              auVar47._24_4_ = uVar17;
              auVar47._28_4_ = uVar17;
              auVar6 = vfmadd213ps_fma(auVar46,auVar53._0_32_,auVar50._0_32_);
              auVar28 = vfmadd213ps_fma(auVar47,auVar54._0_32_,auVar51._0_32_);
              auVar8 = vpminsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar5));
              auVar27 = vpminsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar6));
              auVar8 = vpmaxsd_avx2(auVar8,auVar27);
              auVar27 = vpminsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar28));
              auVar27 = vpmaxsd_avx2(auVar27,local_1280);
              auVar8 = vpmaxsd_avx2(auVar8,auVar27);
              auVar27 = vpmaxsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar5));
              auVar4 = vpmaxsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar6));
              auVar4 = vpminsd_avx2(auVar27,auVar4);
              auVar27 = vpmaxsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar28));
              auVar38 = ZEXT3264(auVar36);
              auVar27 = vpminsd_avx2(auVar27,auVar36);
              auVar27 = vpminsd_avx2(auVar4,auVar27);
              auVar8 = vcmpps_avx(auVar8,auVar27,2);
              uVar24 = uVar23;
              if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar8 >> 0x7f,0) != '\0') ||
                    (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar8 >> 0xbf,0) != '\0') ||
                  (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar8[0x1f] < '\0') {
                uVar17 = *(undefined4 *)(local_1170 + lVar18 * 4);
                auVar29._4_4_ = uVar17;
                auVar29._0_4_ = uVar17;
                auVar29._8_4_ = uVar17;
                auVar29._12_4_ = uVar17;
                auVar33._16_4_ = uVar17;
                auVar33._0_16_ = auVar29;
                auVar33._20_4_ = uVar17;
                auVar33._24_4_ = uVar17;
                auVar33._28_4_ = uVar17;
                uVar24 = *(ulong *)(uVar22 + lVar18 * 8);
                auVar8 = vcmpps_avx(auVar33,auVar31._0_32_,1);
                if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar8 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar8 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar8 >> 0x7f,0) == '\0') &&
                      (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar8 >> 0xbf,0) == '\0') &&
                    (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar8[0x1f]) {
                  *puVar26 = uVar24;
                  uVar24 = uVar23;
                }
                else {
                  if (uVar23 == 8) {
                    auVar31 = ZEXT3264(auVar33);
                    goto LAB_00595709;
                  }
                  *puVar26 = uVar23;
                  auVar29 = auVar31._0_16_;
                  auVar31 = ZEXT3264(auVar33);
                }
                uVar20 = uVar20 + 1;
                *(int *)(puVar26 + 1) = auVar29._0_4_;
                puVar26 = puVar26 + 2;
              }
LAB_00595709:
              uVar19 = uVar19 - 1 & uVar19;
              uVar23 = uVar24;
            } while (uVar19 != 0);
            if (uVar24 == 8) goto LAB_005958ec;
            uVar22 = uVar24;
            if (1 < uVar20) {
              pauVar1 = (undefined1 (*) [16])(puVar26 + -4);
              puVar2 = puVar26 + -2;
              if ((uint)puVar26[-3] < (uint)puVar26[-1]) {
                *(int *)(puVar26 + -3) = (int)puVar26[-1];
                *(ulong *)*pauVar1 = *puVar2;
                local_1300._0_8_ = SUB168(*pauVar1,0);
                *puVar2 = local_1300._0_8_;
                local_1300.i[2] = SUB164(*pauVar1,8);
                *(float *)(puVar26 + -1) = local_1300.v[2];
              }
              if (uVar20 != 2) {
                pauVar3 = (undefined1 (*) [16])(puVar26 + -6);
                uVar16 = (uint)puVar26[-5];
                if (uVar16 < (uint)puVar26[-1]) {
                  *(int *)(puVar26 + -5) = (int)puVar26[-1];
                  *(ulong *)*pauVar3 = *puVar2;
                  local_1300._0_8_ = SUB168(*pauVar3,0);
                  *puVar2 = local_1300._0_8_;
                  local_1300.i[2] = SUB164(*pauVar3,8);
                  *(float *)(puVar26 + -1) = local_1300.v[2];
                  uVar16 = (uint)puVar26[-5];
                }
                if (uVar16 < (uint)puVar26[-3]) {
                  auVar9 = *pauVar3;
                  *(int *)(puVar26 + -5) = (int)puVar26[-3];
                  *(undefined8 *)*pauVar3 = *(undefined8 *)*pauVar1;
                  local_1300._0_8_ = auVar9._0_8_;
                  *(undefined8 *)*pauVar1 = local_1300._0_8_;
                  local_1300.i[2] = auVar9._8_4_;
                  *(float *)(puVar26 + -3) = local_1300.v[2];
                }
              }
            }
          }
          local_fc0 = auVar38._0_32_;
          local_1300 = (anon_union_32_3_898e2e57_for_vboolf_impl<8>_1)
                       vcmpps_avx(local_fc0,auVar31._0_32_,6);
          if (((((((((undefined1  [32])local_1300 >> 0x1f & (undefined1  [32])0x1) !=
                    (undefined1  [32])0x0 ||
                   ((undefined1  [32])local_1300 >> 0x3f & (undefined1  [32])0x1) !=
                   (undefined1  [32])0x0) ||
                  ((undefined1  [32])local_1300 >> 0x5f & (undefined1  [32])0x1) !=
                  (undefined1  [32])0x0) || SUB321((undefined1  [32])local_1300 >> 0x7f,0) != '\0')
                || ((undefined1  [32])local_1300 & (undefined1  [32])0x100000000) !=
                   (undefined1  [32])0x0) || SUB321((undefined1  [32])local_1300 >> 0xbf,0) != '\0')
              || ((undefined1  [32])local_1300 & (undefined1  [32])0x100000000) !=
                 (undefined1  [32])0x0) || local_1300.i[7]._3_1_ < '\0') {
            lVar18 = (ulong)((uint)uVar22 & 0xf) - 8;
            if (lVar18 != 0) {
              prim = (Primitive *)(uVar22 & 0xfffffffffffffff0);
              do {
                local_12d0 = (undefined4)lVar18;
                uStack_12cc = (undefined4)((ulong)lVar18 >> 0x20);
                InstanceIntersectorK<8>::intersect
                          ((vbool<8> *)&local_1300.field_1,&local_1301,ray,context,prim);
                prim = prim + 1;
                lVar18 = CONCAT44(uStack_12cc,local_12d0) + -1;
                context = local_12a0;
                ray = local_12a8;
              } while (lVar18 != 0);
              auVar52 = ZEXT3264(local_fe0);
              auVar53 = ZEXT3264(local_1000);
              auVar54 = ZEXT3264(local_1020);
              auVar55 = ZEXT3264(CONCAT428(uStack_10e4,
                                           CONCAT424(fStack_10e8,
                                                     CONCAT420(fStack_10ec,
                                                               CONCAT416(fStack_10f0,
                                                                         CONCAT412(fStack_10f4,
                                                                                   CONCAT48(
                                                  fStack_10f8,CONCAT44(fStack_10fc,local_1100)))))))
                                );
              auVar50 = ZEXT3264(CONCAT428(uStack_1104,
                                           CONCAT424(fStack_1108,
                                                     CONCAT420(fStack_110c,
                                                               CONCAT416(fStack_1110,
                                                                         CONCAT412(fStack_1114,
                                                                                   CONCAT48(
                                                  fStack_1118,CONCAT44(fStack_111c,local_1120)))))))
                                );
              auVar51 = ZEXT3264(CONCAT428(uStack_1124,
                                           CONCAT424(fStack_1128,
                                                     CONCAT420(fStack_112c,
                                                               CONCAT416(fStack_1130,
                                                                         CONCAT412(fStack_1134,
                                                                                   CONCAT48(
                                                  fStack_1138,CONCAT44(fStack_113c,local_1140)))))))
                                );
              auVar38 = ZEXT3264(local_fc0);
            }
            auVar8 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar38._0_32_,1);
            auVar8 = (undefined1  [32])local_1300 & auVar8;
            if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar8 >> 0x7f,0) != '\0') ||
                  (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar8 >> 0xbf,0) != '\0') ||
                (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar8[0x1f] < '\0') {
              auVar8 = vblendvps_avx(auVar38._0_32_,*(undefined1 (*) [32])(ray + 0x100),
                                     (undefined1  [32])local_1300);
              auVar38 = ZEXT3264(auVar8);
              auVar27 = vshufps_avx(auVar8,auVar8,0xb1);
              auVar8 = vmaxps_avx(auVar8,auVar27);
              auVar27 = vshufpd_avx(auVar8,auVar8,5);
              auVar8 = vmaxps_avx(auVar8,auVar27);
              local_12e0 = vmaxss_avx(auVar8._0_16_,auVar8._16_16_);
            }
          }
        }
        local_12d0 = local_12e0._0_4_;
        uStack_12cc = local_12d0;
        uStack_12c8 = local_12d0;
        uStack_12c4 = local_12d0;
LAB_005958ec:
      } while (puVar26 != &local_fa0);
    } while (local_12b0 != 0);
  }
  return;
}

Assistant:

static __forceinline vboolf8 operator ==(const vint8& a, const vint8& b) { return _mm256_castsi256_ps(_mm256_cmpeq_epi32(a, b)); }